

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O3

void __thiscall
randomx::AssemblyGeneratorX86::h_IMULH_M(AssemblyGeneratorX86 *this,Instruction *instr,int i)

{
  undefined1 *puVar1;
  byte bVar2;
  size_t sVar3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  
  bVar2 = instr->dst;
  this->registerUsage[bVar2] = i;
  if (instr->src == bVar2) {
    puVar1 = &this->field_0x10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\tmov rax, ",10);
    pcVar6 = *(char **)(regR + (ulong)instr->dst * 8);
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,pcVar6,sVar3);
    std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + (char)puVar1);
    std::ostream::put((char)puVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\tmul qword ptr [",0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"rsi",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"+",1);
    poVar4 = (ostream *)std::ostream::operator<<(puVar1,instr->imm32 & 0x1ffff8);
    pcVar6 = "]";
    lVar5 = 1;
  }
  else {
    genAddressReg(this,instr,"ecx");
    poVar4 = (ostream *)&this->field_0x10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tmov rax, ",10);
    pcVar6 = *(char **)(regR + (ulong)instr->dst * 8);
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,sVar3);
    std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tmul qword ptr [",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"rsi",3);
    pcVar6 = "+rcx]";
    lVar5 = 5;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,lVar5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  puVar1 = &this->field_0x10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\tmov ",5);
  pcVar6 = *(char **)(regR + (ulong)instr->dst * 8);
  sVar3 = strlen(pcVar6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,pcVar6,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,", rdx",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + (char)puVar1);
  std::ostream::put((char)puVar1);
  std::ostream::flush();
  return;
}

Assistant:

void AssemblyGeneratorX86::h_IMULH_M(Instruction& instr, int i) {
		registerUsage[instr.dst] = i;
		if (instr.src != instr.dst) {
			genAddressReg(instr, "ecx");
			asmCode << "\tmov rax, " << regR[instr.dst] << std::endl;
			asmCode << "\tmul qword ptr [" << regScratchpadAddr << "+rcx]" << std::endl;
		}
		else {
			asmCode << "\tmov rax, " << regR[instr.dst] << std::endl;
			asmCode << "\tmul qword ptr [" << regScratchpadAddr << "+" << genAddressImm(instr) << "]" << std::endl;
		}
		asmCode << "\tmov " << regR[instr.dst] << ", rdx" << std::endl;
		traceint(instr);
	}